

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QStringView>::emplace<QStringView>
          (QPodArrayOps<QStringView> *this,qsizetype i,QStringView *args)

{
  QStringView **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  storage_type_conflict *psVar5;
  qsizetype qVar6;
  QStringView *pQVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QStringView>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00123af9:
    psVar5 = args->m_data;
    qVar6 = args->m_size;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QStringView>).size != 0);
    QArrayDataPointer<QStringView>::detachAndGrow
              (&this->super_QArrayDataPointer<QStringView>,where,1,(QStringView **)0x0,
               (QArrayDataPointer<QStringView> *)0x0);
    pQVar7 = createHole(this,where,i,1);
    pQVar7->m_data = psVar5;
    pQVar7->m_size = qVar6;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QStringView>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QStringView>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
        lVar4)) {
      qVar6 = args->m_size;
      pQVar7 = (this->super_QArrayDataPointer<QStringView>).ptr + lVar4;
      pQVar7->m_data = args->m_data;
      pQVar7->m_size = qVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QStringView *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QStringView>).ptr)) goto LAB_00123af9;
      pQVar7 = (this->super_QArrayDataPointer<QStringView>).ptr;
      qVar6 = args->m_size;
      pQVar7[-1].m_data = args->m_data;
      pQVar7[-1].m_size = qVar6;
      ppQVar1 = &(this->super_QArrayDataPointer<QStringView>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QStringView>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }